

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

panel * get_panel_misc(void)

{
  uint uVar1;
  panel *p;
  panel_line *ppVar2;
  
  p = (panel *)mem_zalloc(0x18);
  p->len = 0;
  p->max = 7;
  ppVar2 = (panel_line *)mem_zalloc(0x118);
  p->lines = ppVar2;
  panel_line(p,'\x0e',"Age","%d",(ulong)(uint)(int)player->age);
  uVar1 = (int)player->ht / 0xc;
  panel_line(p,'\x0e',"Height","%d\'%d\"",(ulong)uVar1,
             (ulong)(uint)(int)(short)(player->ht + (short)uVar1 * -0xc));
  uVar1 = (int)player->wt / 0xe;
  panel_line(p,'\x0e',"Weight","%dst %dlb",(ulong)uVar1,
             (ulong)(uint)(int)(short)((short)uVar1 * -0xe + player->wt));
  panel_line(p,'\x0e',"Turns used:","");
  panel_line(p,'\x0e',"Game","%d",(ulong)(uint)turn);
  panel_line(p,'\x0e',"Standard","%d",(ulong)player->total_energy / 100);
  panel_line(p,'\x0e',"Resting","%d",(ulong)player->resting_turn);
  return p;
}

Assistant:

static struct panel *get_panel_misc(void) {
	struct panel *p = panel_allocate(7);
	uint8_t attr = COLOUR_L_BLUE;

	panel_line(p, attr, "Age", "%d", player->age);
	panel_line(p, attr, "Height", "%d'%d\"", player->ht / 12, player->ht % 12);
	panel_line(p, attr, "Weight", "%dst %dlb", player->wt / 14, player->wt % 14);
	panel_line(p, attr, "Turns used:", "");
	panel_line(p, attr, "Game", "%d", turn);
	panel_line(p, attr, "Standard", "%d", player->total_energy / 100);
	panel_line(p, attr, "Resting", "%d", player->resting_turn);

	return p;
}